

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O1

Object<(anonymous_namespace)::ObjectStruct> * __thiscall
cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::
Bind<(anonymous_namespace)::ObjectStruct,std::__cxx11::string,std::function<(anonymous_namespace)::ErrorCode(std::__cxx11::string&,Json::Value_const*)>>
          (Object<(anonymous_namespace)::ObjectStruct> *this,string_view *name,
          offset_in_ObjectStruct_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
          member,function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                 *func,bool required)

{
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  _Any_data local_48;
  code *local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  std::
  function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
  ::function((function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
              *)&local_48,
             (function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
              *)member);
  local_28 = 0;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_58 = (code *)0x0;
  pcStack_50 = (code *)0x0;
  local_68._M_unused._M_object = operator_new(0x28);
  *(undefined8 *)local_68._M_unused._0_8_ = 0;
  *(undefined8 *)((long)local_68._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)local_68._M_unused._0_8_ + 0x10) = 0;
  *(undefined8 *)((long)local_68._M_unused._0_8_ + 0x18) = uStack_30;
  if (local_38 != (code *)0x0) {
    *(void **)local_68._M_unused._0_8_ = local_48._M_unused._M_object;
    *(undefined8 *)((long)local_68._M_unused._0_8_ + 8) = local_48._8_8_;
    *(code **)((long)local_68._M_unused._0_8_ + 0x10) = local_38;
    local_38 = (code *)0x0;
    uStack_30 = 0;
  }
  *(undefined8 *)((long)local_68._M_unused._0_8_ + 0x20) = 0;
  pcStack_50 = std::
               _Function_handler<(anonymous_namespace)::ErrorCode_((anonymous_namespace)::ObjectStruct_&,_const_Json::Value_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmJSONHelpers.h:40:32)>
               ::_M_invoke;
  local_58 = std::
             _Function_handler<(anonymous_namespace)::ErrorCode_((anonymous_namespace)::ObjectStruct_&,_const_Json::Value_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmJSONHelpers.h:40:32)>
             ::_M_manager;
  BindPrivate(this,name,(MemberFunction *)&local_68,SUB81(func,0));
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  return this;
}

Assistant:

Object& Bind(const cm::string_view& name, M U::*member, F func,
                 bool required = true)
    {
      return this->BindPrivate(name,
                               [func, member](T& out, const Json::Value* value,
                                              CallState&&... state) -> E {
                                 return func(out.*member, value,
                                             std::forward(state)...);
                               },
                               required);
    }